

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::GetBlockInfo(WasmBytecodeGenerator *this,uint32 relativeDepth)

{
  BlockInfo **ppBVar1;
  WasmCompilationException *this_00;
  
  if (relativeDepth <
      (uint)(this->m_blockInfos).list.
            super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count) {
    ppBVar1 = JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                        (&this->m_blockInfos,relativeDepth);
    return *ppBVar1;
  }
  this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException(this_00,L"Invalid branch target");
  __cxa_throw(this_00,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

BlockInfo* WasmBytecodeGenerator::GetBlockInfo(uint32 relativeDepth) const
{
    if (relativeDepth >= (uint32)m_blockInfos.Count())
    {
        throw WasmCompilationException(_u("Invalid branch target"));
    }
    return m_blockInfos.Peek(relativeDepth);
}